

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O3

bool is_limiter(char c)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  do {
    pcVar1 = &ninx::lexer::LIMITER_CHARS + lVar2;
    if (*pcVar1 == c) break;
    bVar3 = lVar2 != 0x11;
    lVar2 = lVar2 + 1;
  } while (bVar3);
  return *pcVar1 == c;
}

Assistant:

bool is_limiter(char c) {
    bool found = false;
    for (char i : ninx::lexer::LIMITER_CHARS) {
        if (i == c) {
            found = true;
            break;
        }
    }
    return found;
}